

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid,char *project,char *options)

{
  REF_NODE pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  undefined8 uVar10;
  REF_LONG ref_private_status_reis_ai;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT new_node;
  REF_INT ntet;
  REF_INT nnode;
  REF_INT face_id;
  REF_GLOB global;
  REF_DBL xyz [3];
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT nodes [27];
  char command [1024];
  char filename [1024];
  ulong local_918;
  int local_90c;
  int local_908;
  uint local_904;
  int local_900;
  int local_8fc;
  REF_CELL local_8f8;
  REF_INT local_8ec;
  int local_8e8;
  undefined1 local_8e4 [4];
  ulong local_8e0;
  REF_DBL local_8d8;
  REF_DBL local_8d0;
  REF_DBL local_8c8 [2];
  undefined1 local_8b4 [4];
  undefined1 local_8b0 [4];
  undefined1 local_8ac [4];
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  char local_838 [1024];
  char local_438 [1032];
  
  pRVar1 = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)pRVar1->n,(ulong)(uint)ref_grid->cell[3]->n)
  ;
  snprintf(local_438,0x400,"%s-aflr-surface.lb8.ugrid",project);
  uVar3 = ref_export_by_extension(ref_grid,local_438);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x97b,
           "ref_geom_aflr_volume",(ulong)uVar3,"ugrid");
    return uVar3;
  }
  if (options == (char *)0x0) {
    pcVar9 = 
    "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid -mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 < /dev/null > %s-aflr.txt"
    ;
    options = project;
  }
  else {
    pcVar9 = 
    "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid %s < /dev/null > %s-aflr.txt"
    ;
  }
  snprintf(local_838,0x400,pcVar9,project,project,options);
  puts(local_838);
  fflush(_stdout);
  iVar4 = system(local_838);
  if (iVar4 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x98e,
           "ref_geom_aflr_volume","aflr failed",0,(long)iVar4);
    return 1;
  }
  local_8ec = pRVar1->n;
  pcVar9 = local_438;
  snprintf(pcVar9,0x400,"%s-aflr-volume.ugrid",project);
  ref_node = ref_grid->node;
  __stream = fopen(pcVar9,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",local_438);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x932,
           "ref_import_ugrid_tets","unable to open file");
    uVar3 = 2;
  }
  else {
    iVar4 = __isoc99_fscanf(__stream,"%d",&local_8fc);
    if (iVar4 == 1) {
      iVar4 = __isoc99_fscanf(__stream,"%d",&local_908);
      if (iVar4 == 1) {
        iVar4 = __isoc99_fscanf(__stream,"%d",&local_90c);
        if (iVar4 == 1) {
          iVar4 = __isoc99_fscanf(__stream,"%d",&local_900);
          if (iVar4 == 1) {
            iVar4 = __isoc99_fscanf(__stream,"%d",local_8ac);
            if (iVar4 == 1) {
              iVar4 = __isoc99_fscanf(__stream,"%d",local_8b0);
              if (iVar4 == 1) {
                iVar4 = __isoc99_fscanf(__stream,"%d",local_8b4);
                if (iVar4 == 1) {
                  if (0 < local_8fc) {
                    local_8f8 = (REF_CELL)(long)ref_node->n;
                    local_918 = 0;
                    do {
                      iVar4 = __isoc99_fscanf(__stream,"%lf",&local_8d8);
                      if (iVar4 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x93f,"ref_import_ugrid_tets","x",1,(long)iVar4);
                        pcVar9 = (char *)0x1;
                      }
                      uVar3 = (uint)pcVar9;
                      if (iVar4 != 1) goto LAB_001a1cc8;
                      iVar4 = __isoc99_fscanf(__stream,"%lf",&local_8d0);
                      if (iVar4 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x940,"ref_import_ugrid_tets","y",1,(long)iVar4);
                        pcVar9 = (char *)0x1;
                      }
                      uVar3 = (uint)pcVar9;
                      if (iVar4 != 1) goto LAB_001a1cc8;
                      iVar4 = __isoc99_fscanf(__stream,"%lf",local_8c8);
                      if (iVar4 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x941,"ref_import_ugrid_tets","z",1,(long)iVar4);
                        pcVar9 = (char *)0x1;
                      }
                      uVar3 = (uint)pcVar9;
                      if (iVar4 != 1) goto LAB_001a1cc8;
                      if ((long)local_8f8 <= (long)local_918) {
                        uVar5 = ref_node_next_global(ref_node,(REF_GLOB *)&local_8e0);
                        if (uVar5 != 0) {
                          pcVar9 = (char *)(ulong)uVar5;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0x943,"ref_import_ugrid_tets",(ulong)uVar5,"next global");
                        }
                        uVar7 = local_8e0;
                        uVar3 = (uint)pcVar9;
                        if (uVar5 != 0) goto LAB_001a1cc8;
                        if (local_918 != local_8e0) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0x944,"ref_import_ugrid_tets","global node index",local_918,
                                 local_8e0);
                          pcVar9 = (char *)0x1;
                        }
                        uVar3 = (uint)pcVar9;
                        if (local_918 != uVar7) goto LAB_001a1cc8;
                        uVar5 = ref_node_add(ref_node,local_8e0,(REF_INT *)&local_904);
                        if (uVar5 != 0) {
                          pcVar9 = (char *)(ulong)uVar5;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0x945,"ref_import_ugrid_tets",(ulong)uVar5,"new_node");
                        }
                        uVar3 = (uint)pcVar9;
                        if (uVar5 != 0) goto LAB_001a1cc8;
                        uVar7 = (ulong)local_904;
                        if (local_918 != uVar7) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0x946,"ref_import_ugrid_tets","node index",local_918,
                                 (long)(int)local_904);
                          pcVar9 = (char *)0x1;
                        }
                        uVar3 = (uint)pcVar9;
                        if (local_918 != uVar7) goto LAB_001a1cc8;
                        pRVar2 = ref_node->real;
                        lVar8 = (long)(int)local_904;
                        pRVar2[lVar8 * 0xf] = local_8d8;
                        pRVar2[lVar8 * 0xf + 1] = local_8d0;
                        pRVar2[lVar8 * 0xf + 2] = local_8c8[0];
                      }
                      local_918 = local_918 + 1;
                    } while ((long)local_918 < (long)local_8fc);
                  }
                  if (0 < local_908) {
                    iVar4 = 0;
                    do {
                      lVar8 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar8);
                        if (iVar6 != 1) {
                          pcVar9 = "tri";
                          uVar10 = 0x94f;
                          goto LAB_001a1cbb;
                        }
                        lVar8 = lVar8 + 4;
                      } while (lVar8 != 0xc);
                      iVar4 = iVar4 + 1;
                    } while (iVar4 < local_908);
                  }
                  if (0 < local_90c) {
                    iVar4 = 0;
                    do {
                      lVar8 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar8);
                        if (iVar6 != 1) {
                          pcVar9 = "qua";
                          uVar10 = 0x953;
                          goto LAB_001a1cbb;
                        }
                        lVar8 = lVar8 + 4;
                      } while (lVar8 != 0x10);
                      iVar4 = iVar4 + 1;
                    } while (iVar4 < local_90c);
                  }
                  if (0 < local_908) {
                    iVar4 = 0;
                    do {
                      iVar6 = __isoc99_fscanf(__stream,"%d",local_8e4);
                      if (iVar6 != 1) {
                        pcVar9 = "tri id";
                        uVar10 = 0x957;
                        goto LAB_001a1cbb;
                      }
                      iVar4 = iVar4 + 1;
                    } while (iVar4 < local_908);
                  }
                  if (0 < local_90c) {
                    iVar4 = 0;
                    do {
                      iVar6 = __isoc99_fscanf(__stream,"%d",local_8e4);
                      if (iVar6 != 1) {
                        pcVar9 = "qua id";
                        uVar10 = 0x95b;
                        goto LAB_001a1cbb;
                      }
                      iVar4 = iVar4 + 1;
                    } while (iVar4 < local_90c);
                  }
                  if (0 < local_900) {
                    local_8f8 = ref_grid->cell[8];
                    iVar4 = 0;
                    do {
                      lVar8 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar8);
                        if (iVar6 != 1) {
                          pcVar9 = "tet";
                          uVar10 = 0x961;
                          goto LAB_001a1cbb;
                        }
                        lVar8 = lVar8 + 4;
                      } while (lVar8 != 0x10);
                      local_8a8 = local_8a8 + -1;
                      local_8a4 = local_8a4 + -1;
                      local_8a0 = local_8a0 + -1;
                      local_89c = local_89c + -1;
                      uVar5 = ref_cell_add(local_8f8,&local_8a8,&local_8e8);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0x966,"ref_import_ugrid_tets",(ulong)uVar5,"new tet");
                        pcVar9 = (char *)(ulong)uVar5;
                      }
                      uVar3 = (uint)pcVar9;
                      if (uVar5 != 0) goto LAB_001a1cc8;
                      if (iVar4 != local_8e8) {
                        pcVar9 = "tet index";
                        uVar10 = 0x967;
                        goto LAB_001a1cbb;
                      }
                      iVar4 = iVar4 + 1;
                    } while (iVar4 < local_900);
                  }
                  fclose(__stream);
                  uVar3 = 0;
                  goto LAB_001a1cc8;
                }
                pcVar9 = "nhex";
                uVar10 = 0x93a;
              }
              else {
                pcVar9 = "npri";
                uVar10 = 0x939;
              }
            }
            else {
              pcVar9 = "npyr";
              uVar10 = 0x938;
            }
          }
          else {
            pcVar9 = "ntet";
            uVar10 = 0x937;
          }
        }
        else {
          pcVar9 = "nqua";
          uVar10 = 0x936;
        }
      }
      else {
        pcVar9 = "ntri";
        uVar10 = 0x935;
      }
    }
    else {
      pcVar9 = "nnode";
      uVar10 = 0x934;
    }
LAB_001a1cbb:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
           "ref_import_ugrid_tets",pcVar9);
    uVar3 = 1;
  }
LAB_001a1cc8:
  if (uVar3 == 0) {
    uVar3 = 0;
    printf("%d interior nodes\n",(ulong)(uint)(pRVar1->n - local_8ec));
    ref_grid->surf = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x993,
           "ref_geom_aflr_volume",(ulong)uVar3,"tets only");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid, const char *project,
                                        const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  char filename[1024];
  char command[1024];
  int system_status;
  REF_INT nnode_surface;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 1024, "%s-aflr-surface.lb8.ugrid", project);
  RSS(ref_export_by_extension(ref_grid, filename), "ugrid");
  if (NULL == options) {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "-mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 "
        "< /dev/null > %s-aflr.txt",
        project, project, project);
  } else {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "%s "
        "< /dev/null > %s-aflr.txt",
        project, project, options, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  system_status = system(command);
  REIS(0, system_status, "aflr failed");

  nnode_surface = ref_node_n(ref_node);

  snprintf(filename, 1024, "%s-aflr-volume.ugrid", project);
  RSS(ref_import_ugrid_tets(ref_grid, filename), "tets only");

  printf("%d interior nodes\n", ref_node_n(ref_node) - nnode_surface);

  ref_grid_surf(ref_grid) = REF_FALSE;

  return REF_SUCCESS;
}